

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O3

int Sbl_ManTestSat(Sbl_Man_t *p,int iPivot)

{
  Hsh_VecMan_t *pHVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  lit *plVar4;
  ulong uVar5;
  ABC_INT64_T AVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int *piVar11;
  Vec_Int_t *pVVar12;
  abctime aVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  uint *puVar17;
  uint uVar18;
  ulong uVar20;
  char *__format;
  long lVar21;
  Sbl_Man_t *p_00;
  int iVar22;
  Vec_Int_t *pVVar23;
  ulong uVar24;
  timespec ts;
  undefined8 in_stack_ffffffffffffff68;
  undefined4 uVar25;
  timespec local_90;
  uint local_7c;
  long local_78;
  Vec_Int_t *local_70;
  uint local_68;
  uint local_64;
  size_t local_60;
  uint local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  Sbl_Man_t *local_40;
  long local_38;
  ulong uVar19;
  
  iVar7 = clock_gettime(3,&local_90);
  if (iVar7 < 0) {
    lVar16 = 1;
  }
  else {
    lVar16 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_90.tv_nsec),8);
    lVar16 = ((lVar16 >> 7) - (lVar16 >> 0x3f)) + local_90.tv_sec * -1000000;
  }
  iVar7 = p->pHash->vMap->nSize;
  p->nTried = p->nTried + 1;
  Sbl_ManClean(p);
  iVar8 = Sbl_ManWindow2(p,iPivot);
  if (iVar8 == 0) {
    if (p->fVeryVerbose != 0) {
      printf("Obj %d: Window with less than %d nodes does not exist.\n",iPivot,(ulong)(uint)p->nVars
            );
    }
    p->nSmallWins = p->nSmallWins + 1;
  }
  else {
    local_70 = p->vAnds;
    pHVar1 = p->pHash;
    pVVar12 = pHVar1->vTable;
    pVVar23 = pHVar1->vMap;
    uVar14 = pVVar23->nSize;
    local_78 = CONCAT44(local_78._4_4_,iVar7);
    local_64 = iPivot;
    local_40 = p;
    if (pVVar12->nSize < (int)uVar14) {
      uVar20 = (ulong)(pVVar12->nSize * 2 - 1);
      while( true ) {
        do {
          uVar14 = (uint)uVar20;
          uVar18 = uVar14 + 1;
          uVar19 = (ulong)uVar18;
          uVar15 = uVar20 & 1;
          uVar20 = uVar19;
        } while (uVar15 != 0);
        if (uVar18 < 9) break;
        iVar7 = 5;
        while (uVar18 % (iVar7 - 2U) != 0) {
          uVar9 = iVar7 * iVar7;
          iVar7 = iVar7 + 2;
          if (uVar18 < uVar9) goto LAB_00755f51;
        }
      }
LAB_00755f51:
      if (pVVar12->nCap < (int)uVar18) {
        if (pVVar12->pArray == (int *)0x0) {
          piVar11 = (int *)malloc((long)(int)uVar18 << 2);
        }
        else {
          piVar11 = (int *)realloc(pVVar12->pArray,(long)(int)uVar18 << 2);
        }
        pVVar12->pArray = piVar11;
        if (piVar11 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        pVVar12->nCap = uVar18;
      }
      if (uVar14 < 0x7fffffff) {
        memset(pVVar12->pArray,0xff,uVar19 << 2);
      }
      pVVar12->nSize = uVar18;
      pVVar12 = pHVar1->vTable;
      pVVar23 = pHVar1->vMap;
      uVar14 = pVVar23->nSize;
      if (0 < (int)uVar14) {
        pVVar2 = pHVar1->vData;
        piVar11 = pVVar23->pArray;
        lVar21 = 0;
        do {
          iVar7 = piVar11[lVar21];
          if (((long)iVar7 < 0) || (pVVar2->nSize <= iVar7)) goto LAB_00756d85;
          piVar11 = pVVar2->pArray + iVar7;
          iVar7 = *piVar11;
          (pHVar1->vTemp).nCap = iVar7;
          (pHVar1->vTemp).nSize = iVar7;
          (pHVar1->vTemp).pArray = piVar11 + 2;
          if ((long)iVar7 < 1) {
            uVar14 = 0;
          }
          else {
            uVar20 = 0;
            uVar14 = 0;
            do {
              uVar14 = uVar14 + (&Hsh_VecManHash_s_Primes)[uVar20 % 7] * (piVar11 + 2)[uVar20];
              uVar20 = uVar20 + 1;
            } while ((long)iVar7 != uVar20);
          }
          uVar20 = (ulong)uVar14 % (ulong)(uint)pVVar12->nSize;
          if (((int)uVar20 < 0) || (pVVar12->nSize <= (int)uVar20)) goto LAB_00756d85;
          if (pVVar23->nSize <= lVar21) goto LAB_00756da4;
          piVar11 = pVVar23->pArray;
          iVar7 = piVar11[lVar21];
          if (((long)iVar7 < 0) || (pVVar2->nSize <= iVar7)) goto LAB_00756d85;
          piVar3 = pVVar12->pArray;
          pVVar2->pArray[(long)iVar7 + 1] = piVar3[uVar20];
          piVar3[uVar20] = (int)lVar21;
          lVar21 = lVar21 + 1;
          uVar14 = pVVar23->nSize;
        } while (lVar21 < (int)uVar14);
      }
    }
    iVar7 = local_70->nSize;
    uVar20 = (ulong)iVar7;
    if ((long)uVar20 < 1) {
      uVar18 = 0;
    }
    else {
      uVar15 = 0;
      uVar18 = 0;
      do {
        uVar18 = uVar18 + (&Hsh_VecManHash_s_Primes)[uVar15 % 7] * local_70->pArray[uVar15];
        uVar15 = uVar15 + 1;
      } while (uVar20 != uVar15);
    }
    uVar15 = (ulong)uVar18 % (ulong)(uint)pVVar12->nSize;
    iVar8 = (int)uVar15;
    local_38 = lVar16;
    if ((iVar8 < 0) || (pVVar12->nSize <= iVar8)) {
LAB_00756d85:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    puVar17 = (uint *)(pVVar12->pArray + uVar15);
    uVar18 = *puVar17;
    pVVar12 = pHVar1->vData;
    if (uVar18 != 0xffffffff) {
      local_60 = uVar20 << 2;
      do {
        if (((int)uVar18 < 0) || ((int)uVar14 <= (int)uVar18)) goto LAB_00756da4;
        iVar8 = pVVar23->pArray[uVar18];
        if (((long)iVar8 < 0) || (pVVar12->nSize <= iVar8)) goto LAB_00756d85;
        if (pVVar12->pArray == (int *)0x0) break;
        piVar11 = pVVar12->pArray + iVar8;
        if ((*piVar11 == iVar7) && (iVar8 = bcmp(piVar11 + 2,local_70->pArray,local_60), iVar8 == 0)
           ) goto LAB_0075623b;
        uVar18 = piVar11[1];
        puVar17 = (uint *)(piVar11 + 1);
      } while (uVar18 != 0xffffffff);
    }
    *puVar17 = uVar14;
    if ((pVVar12->nSize & 1U) != 0) {
      __assert_fail("Vec_IntSize(p->vData) % 2 == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecHsh.h"
                    ,0x17a,"int Hsh_VecManAdd(Hsh_VecMan_t *, Vec_Int_t *)");
    }
    Vec_IntPush(pVVar23,pVVar12->nSize);
    pVVar12 = local_70;
    Vec_IntPush(pHVar1->vData,local_70->nSize);
    Vec_IntPush(pHVar1->vData,-1);
    uVar20 = (ulong)(uint)pVVar12->nSize;
    if (0 < pVVar12->nSize) {
      lVar16 = 0;
      do {
        Vec_IntPush(pHVar1->vData,pVVar12->pArray[lVar16]);
        lVar16 = lVar16 + 1;
        uVar20 = (ulong)pVVar12->nSize;
      } while (lVar16 < (long)uVar20);
    }
    if ((uVar20 & 1) != 0) {
      Vec_IntPush(pHVar1->vData,-1);
    }
LAB_0075623b:
    p_00 = local_40;
    uVar14 = local_64;
    if ((int)local_78 == local_40->pHash->vMap->nSize) {
      if (local_40->fVeryVerbose != 0) {
        printf("Obj %d: This window was already tried.\n",(ulong)local_64);
      }
      p_00->nHashWins = p_00->nHashWins + 1;
    }
    else {
      if (local_40->fVeryVerbose != 0) {
        printf("\nObj = %6d : Leaf = %2d.  AND = %2d.  Root = %2d.    LUT = %2d.\n",(ulong)local_64,
               (ulong)(uint)local_40->vLeaves->nSize,(ulong)(uint)local_40->vAnds->nSize);
      }
      uVar18 = p_00->vLeaves->nSize;
      if (((int)uVar18 < 0x81) && (iVar7 = p_00->vAnds->nSize, iVar7 <= p_00->nVars)) {
        if (iVar7 < 10) {
          if (p_00->fVeryVerbose == 0) {
            return 0;
          }
          puts("Skipping.");
          return 0;
        }
        Sbl_ManComputeCuts(p_00);
        Sbl_ManCreateCnf(p_00);
        if (p_00->fVeryVeryVerbose != 0) {
          uVar18 = sat_solver_nclauses(p_00->pSat);
          uVar14 = p_00->vAnds->nSize;
          iVar7 = p_00->vCutsI1->nSize;
          sat_solver_nclauses(p_00->pSat);
          printf("All clauses = %d.  Multi clauses = %d.  Binary clauses = %d.  Other clauses = %d.\n\n"
                 ,(ulong)uVar18,(ulong)uVar14,(ulong)(iVar7 - uVar14));
        }
        pVVar12 = p_00->vAssump;
        pVVar12->nSize = 0;
        Vec_IntPush(pVVar12,-1);
        iVar7 = p_00->vAnds->nSize;
        if (iVar7 < p_00->Power2) {
          iVar8 = iVar7 * 2 + 1;
          iVar22 = iVar7;
          do {
            if (iVar7 < 0) goto LAB_00756de2;
            Vec_IntPush(p_00->vAssump,iVar8);
            iVar22 = iVar22 + 1;
            iVar8 = iVar8 + 2;
          } while (iVar22 < p_00->Power2);
        }
        pVVar12 = p_00->vRootVars;
        if (0 < pVVar12->nSize) {
          lVar16 = 0;
          do {
            if (pVVar12->pArray[lVar16] < 0) goto LAB_00756de2;
            Vec_IntPush(p_00->vAssump,pVVar12->pArray[lVar16] * 2);
            lVar16 = lVar16 + 1;
            pVVar12 = p_00->vRootVars;
          } while (lVar16 < pVVar12->nSize);
        }
        local_4c = p_00->vSolInit->nSize + 1;
        iVar7 = 1;
        local_7c = 0;
        local_68 = 0;
        do {
          uVar25 = (undefined4)((ulong)in_stack_ffffffffffffff68 >> 0x20);
          if ((iVar7 == 0) || (uVar14 = local_4c - iVar7, (int)uVar14 < 1)) goto LAB_00756c79;
          if (p_00->fVeryVerbose != 0) {
            printf("Trying to find mapping with %d LUTs.\n",(ulong)uVar14);
          }
          if (p_00->vCardVars->nSize <= (int)uVar14) {
LAB_00756da4:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar8 = p_00->vCardVars->pArray[uVar14];
          if (iVar8 < 0) {
LAB_00756de2:
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf1,"int Abc_Var2Lit(int, int)");
          }
          if (p_00->vAssump->nSize < 1) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          *p_00->vAssump->pArray = iVar8 * 2 + 1;
          local_50 = iVar7;
          iVar7 = clock_gettime(3,&local_90);
          lVar16 = -1;
          local_78 = -1;
          if (-1 < iVar7) {
            local_78 = local_90.tv_nsec / 1000 + local_90.tv_sec * 1000000;
          }
          AVar6 = (p_00->pSat->stats).conflicts;
          plVar4 = p_00->vAssump->pArray;
          in_stack_ffffffffffffff68 = 0;
          iVar8 = sat_solver_solve(p_00->pSat,plVar4,plVar4 + p_00->vAssump->nSize,
                                   (long)p_00->nBTLimit,0,0,0);
          iVar7 = clock_gettime(3,&local_90);
          if (-1 < iVar7) {
            lVar16 = local_90.tv_nsec / 1000 + local_90.tv_sec * 1000000;
          }
          p_00->timeSat = p_00->timeSat + (lVar16 - local_78);
          uVar14 = (int)(p_00->pSat->stats).conflicts - (int)AVar6;
          local_68 = local_68 + uVar14;
          local_7c = local_7c + 1;
          p_00->nRuns = p_00->nRuns + 1;
          if (iVar8 == 1) {
            iVar7 = clock_gettime(3,&local_90);
            if (iVar7 < 0) {
              lVar16 = -1;
            }
            else {
              lVar16 = local_90.tv_nsec / 1000 + local_90.tv_sec * 1000000;
            }
            p_00->timeSatSat = p_00->timeSatSat + (lVar16 - local_78);
            local_54 = uVar14;
            if (p_00->fVeryVeryVerbose != 0) {
              if (0 < p_00->vAnds->nSize) {
                iVar7 = 0;
                do {
                  uVar14 = sat_solver_var_value(p_00->pSat,iVar7);
                  printf("%d",(ulong)uVar14);
                  iVar7 = iVar7 + 1;
                } while (iVar7 < p_00->vAnds->nSize);
              }
              putchar(10);
              if (p_00->vAnds->nSize < 1) {
                uVar14 = 0;
              }
              else {
                uVar20 = 0;
                uVar14 = 0;
                do {
                  iVar22 = (int)uVar20;
                  iVar7 = sat_solver_var_value(p_00->pSat,iVar22);
                  if (iVar7 != 0) {
                    uVar18 = sat_solver_var_value(p_00->pSat,iVar22);
                    printf("%d=%d ",uVar20,(ulong)uVar18);
                    uVar14 = uVar14 + 1;
                  }
                  uVar20 = (ulong)(iVar22 + 1U);
                } while ((int)(iVar22 + 1U) < p_00->vAnds->nSize);
              }
              printf("Count = %d\n",(ulong)uVar14);
            }
            p_00->vSolCur->nSize = 0;
            iVar7 = p_00->FirstVar;
            iVar10 = sat_solver_nvars(p_00->pSat);
            iVar22 = 0;
            if (iVar7 < iVar10) {
              uVar14 = 1;
              iVar22 = 0;
              local_48 = iVar8;
              do {
                iVar10 = sat_solver_var_value(p_00->pSat,iVar7);
                if (iVar10 != 0) {
                  if (p_00->fVeryVeryVerbose != 0) {
                    uVar18 = iVar7 - p_00->FirstVar;
                    if (((int)uVar18 < 0) || (p_00->vCutsObj->nSize <= (int)uVar18))
                    goto LAB_00756da4;
                    iVar10 = p_00->vCutsObj->pArray[uVar18];
                    lVar16 = (long)iVar10;
                    if ((lVar16 < 0) || (p_00->vAnds->nSize <= iVar10)) goto LAB_00756da4;
                    local_70 = (Vec_Int_t *)CONCAT44(local_70._4_4_,uVar14 + 1);
                    printf("Cut %3d : Node = %3d %6d  ",(ulong)uVar14,lVar16,
                           (ulong)(uint)p_00->vAnds->pArray[lVar16]);
                    if (p_00->fVeryVeryVerbose == 0) {
                      uVar14 = (uint)local_70;
                    }
                    else {
                      uVar14 = iVar7 - p_00->FirstVar;
                      if (((((int)uVar14 < 0) || (p_00->vCutsI1->nSize <= (int)uVar14)) ||
                          (p_00->vCutsI2->nSize <= (int)uVar14)) ||
                         (p_00->vCutsN1->nSize <= (int)uVar14)) {
LAB_00756dc3:
                        __assert_fail("i >= 0 && i < p->nSize",
                                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                                      ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
                      }
                      local_60 = CONCAT44(local_60._4_4_,iVar22);
                      local_44 = iVar7;
                      if (p_00->vCutsN2->nSize <= (int)uVar14) goto LAB_00756dc3;
                      uVar20 = p_00->vCutsI1->pArray[uVar14];
                      uVar15 = p_00->vCutsI2->pArray[uVar14];
                      uVar19 = p_00->vCutsN1->pArray[uVar14];
                      uVar5 = p_00->vCutsN2->pArray[uVar14];
                      uVar24 = 0;
                      printf("{ ");
                      iVar22 = 0;
                      do {
                        if ((uVar20 >> (uVar24 & 0x3f) & 1) != 0) {
                          printf("i%d ",uVar24 & 0xffffffff);
                          iVar22 = iVar22 + 1;
                        }
                        uVar24 = uVar24 + 1;
                      } while (uVar24 != 0x40);
                      uVar20 = 0;
                      do {
                        if ((uVar15 >> (uVar20 & 0x3f) & 1) != 0) {
                          printf("i%d ",(ulong)((uint)uVar20 | 0x40));
                          iVar22 = iVar22 + 1;
                        }
                        uVar20 = uVar20 + 1;
                      } while (uVar20 != 0x40);
                      putchar(0x20);
                      iVar8 = local_48;
                      uVar20 = 0;
                      do {
                        if ((uVar19 >> (uVar20 & 0x3f) & 1) != 0) {
                          printf("n%d ",uVar20 & 0xffffffff);
                          iVar22 = iVar22 + 1;
                        }
                        uVar20 = uVar20 + 1;
                      } while (uVar20 != 0x40);
                      uVar20 = 0;
                      uVar14 = (uint)local_70;
                      do {
                        if ((uVar5 >> (uVar20 & 0x3f) & 1) != 0) {
                          printf("n%d ",(ulong)((uint)uVar20 | 0x40));
                          iVar22 = iVar22 + 1;
                        }
                        uVar20 = uVar20 + 1;
                      } while (uVar20 != 0x40);
                      puts("};");
                      iVar22 = (int)local_60 + iVar22;
                      p_00 = local_40;
                      iVar7 = local_44;
                    }
                  }
                  Vec_IntPush(p_00->vSolCur,iVar7 - p_00->FirstVar);
                }
                iVar7 = iVar7 + 1;
                iVar10 = sat_solver_nvars(p_00->pSat);
              } while (iVar7 < iVar10);
            }
            if ((p_00->fDelay == 0) ||
               (iVar7 = Sbl_ManEvaluateMapping(p_00,p_00->DelayMax), iVar7 != 0)) {
              pVVar12 = p_00->vSolBest;
              pVVar12->nSize = 0;
              pVVar23 = p_00->vSolCur;
              if (0 < pVVar23->nSize) {
                lVar16 = 0;
                do {
                  Vec_IntPush(pVVar12,pVVar23->pArray[lVar16]);
                  lVar16 = lVar16 + 1;
                } while (lVar16 < pVVar23->nSize);
              }
              iVar7 = local_50 + 1;
              uVar14 = local_54;
            }
            else {
              if (p_00->fVeryVerbose != 0) {
                printf("Critical path of length (%d) is detected:   ",
                       (ulong)(uint)p_00->vPath->nSize);
                pVVar12 = p_00->vPath;
                if (0 < pVVar12->nSize) {
                  uVar20 = 0;
                  do {
                    if (pVVar12->pArray[uVar20] < 0) {
                      __assert_fail("Lit >= 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                                    ,0xf2,"int Abc_Lit2Var(int)");
                    }
                    uVar14 = (uint)pVVar12->pArray[uVar20] >> 1;
                    if (p_00->vAnds->nSize <= (int)uVar14) goto LAB_00756da4;
                    printf("%d=%d ",uVar20 & 0xffffffff,(ulong)(uint)p_00->vAnds->pArray[uVar14]);
                    uVar20 = uVar20 + 1;
                    pVVar12 = p_00->vPath;
                  } while ((long)uVar20 < (long)pVVar12->nSize);
                }
                putchar(10);
              }
              plVar4 = p_00->vPath->pArray;
              iVar10 = sat_solver_addclause(p_00->pSat,plVar4,plVar4 + p_00->vPath->nSize);
              iVar7 = local_50;
              uVar14 = local_54;
              if (iVar10 == 0) {
                __assert_fail("value",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatLut.c"
                              ,0x452,"int Sbl_ManTestSat(Sbl_Man_t *, int)");
              }
            }
LAB_00756aa5:
            if (p_00->fVeryVerbose != 0) {
              __format = "UNDEC ";
              if (iVar8 == 1) {
                __format = "SAT   ";
              }
              if (iVar8 == -1) {
                __format = "UNSAT ";
              }
LAB_00756ad3:
              local_60 = CONCAT44(local_60._4_4_,iVar22);
              printf(__format);
              printf("confl =%8d.    ",(ulong)uVar14);
              iVar10 = 3;
              iVar22 = clock_gettime(3,&local_90);
              lVar16 = -1;
              lVar21 = -1;
              if (-1 < iVar22) {
                lVar21 = local_90.tv_nsec / 1000 + local_90.tv_sec * 1000000;
              }
              lVar21 = lVar21 - local_78;
              Abc_Print(iVar10,"%s =","Time");
              Abc_Print(iVar10,"%9.2f sec\n",(double)lVar21 / 1000000.0);
              printf("Total ");
              printf("confl =%8d.    ",(ulong)local_68);
              iVar10 = 3;
              iVar22 = clock_gettime(3,&local_90);
              if (-1 < iVar22) {
                lVar16 = local_90.tv_nsec / 1000 + local_90.tv_sec * 1000000;
              }
              lVar16 = lVar16 + local_38;
              Abc_Print(iVar10,"%s =","Time");
              Abc_Print(iVar10,"%9.2f sec\n",(double)lVar16 / 1000000.0);
              if ((iVar8 == 1) && (p_00->fVeryVeryVerbose != 0)) {
                printf("LitCount = %d.\n",local_60 & 0xffffffff);
              }
              putchar(10);
            }
          }
          else {
            if (iVar8 != -1) {
              iVar7 = clock_gettime(3,&local_90);
              uVar25 = (undefined4)((ulong)in_stack_ffffffffffffff68 >> 0x20);
              if (iVar7 < 0) {
                lVar16 = -1;
              }
              else {
                lVar16 = local_90.tv_nsec / 1000 + local_90.tv_sec * 1000000;
              }
              p_00->timeSatUnd = p_00->timeSatUnd + (lVar16 - local_78);
              iVar22 = 0;
              iVar7 = 0;
              if (iVar8 != 0) goto LAB_00756aa5;
              goto LAB_00756c79;
            }
            iVar7 = clock_gettime(3,&local_90);
            if (iVar7 < 0) {
              lVar16 = -1;
            }
            else {
              lVar16 = local_90.tv_nsec / 1000 + local_90.tv_sec * 1000000;
            }
            p_00->timeSatUns = p_00->timeSatUns + (lVar16 - local_78);
            iVar22 = 0;
            __format = "UNSAT ";
            iVar7 = 0;
            if (p_00->fVeryVerbose != 0) goto LAB_00756ad3;
          }
          uVar25 = (undefined4)((ulong)in_stack_ffffffffffffff68 >> 0x20);
        } while (local_7c != 10);
        p_00->nIterOuts = p_00->nIterOuts + 1;
        local_7c = 10;
LAB_00756c79:
        iVar7 = p_00->vSolBest->nSize;
        if ((0 < iVar7) && (iVar7 < p_00->vSolInit->nSize)) {
          Sbl_ManUpdateMapping(p_00);
          if (p_00->pGia->vEdge1 == (Vec_Int_t *)0x0) {
            uVar14 = Sbl_ManCreateTiming(p_00,p_00->DelayMax);
            iVar7 = 0;
          }
          else {
            uVar14 = Gia_ManEvalEdgeDelay(p_00->pGia);
            iVar7 = Gia_ManEvalEdgeCount(p_00->pGia);
          }
          if (p_00->fVerbose != 0) {
            printf("Object %5d : Saved %2d nodes  (Conf =%8d)  Iter =%3d  Delay = %d  Edges = %4d\n"
                   ,(ulong)local_64,(ulong)(uint)(p_00->vSolInit->nSize - p_00->vSolBest->nSize),
                   (ulong)local_68,(ulong)local_7c,(ulong)uVar14,CONCAT44(uVar25,iVar7));
          }
          aVar13 = Abc_Clock();
          p_00->timeTotal = p_00->timeTotal + (aVar13 - p_00->timeStart);
          p_00->nImproved = p_00->nImproved + 1;
          return 2;
        }
        iVar7 = clock_gettime(3,&local_90);
        if (iVar7 < 0) {
          lVar16 = -1;
        }
        else {
          lVar16 = local_90.tv_nsec / 1000 + local_90.tv_sec * 1000000;
        }
        p_00->timeTotal = p_00->timeTotal + (lVar16 - p_00->timeStart);
        return 1;
      }
      if (p_00->fVeryVerbose != 0) {
        printf("Obj %d: Encountered window with %d inputs and %d internal nodes.\n",(ulong)uVar14,
               (ulong)uVar18,(ulong)(uint)p_00->vAnds->nSize);
      }
      p_00->nLargeWins = p_00->nLargeWins + 1;
    }
  }
  return 0;
}

Assistant:

int Sbl_ManTestSat( Sbl_Man_t * p, int iPivot )
{
    int fKeepTrying = 1;
    abctime clk = Abc_Clock(), clk2;
    int i, status, Root, Count, StartSol, nConfTotal = 0, nIters = 0;
    int nEntries = Hsh_VecSize( p->pHash );
    p->nTried++;

    Sbl_ManClean( p );

    // compute one window
    Count = Sbl_ManWindow2( p, iPivot );
    if ( Count == 0 )
    {
        if ( p->fVeryVerbose )
        printf( "Obj %d: Window with less than %d nodes does not exist.\n", iPivot, p->nVars );
        p->nSmallWins++;
        return 0;
    }
    Hsh_VecManAdd( p->pHash, p->vAnds );
    if ( nEntries == Hsh_VecSize(p->pHash) )
    {
        if ( p->fVeryVerbose )
        printf( "Obj %d: This window was already tried.\n", iPivot );
        p->nHashWins++;
        return 0;
    }
    if ( p->fVeryVerbose )
    printf( "\nObj = %6d : Leaf = %2d.  AND = %2d.  Root = %2d.    LUT = %2d.\n", 
        iPivot, Vec_IntSize(p->vLeaves), Vec_IntSize(p->vAnds), Vec_IntSize(p->vRoots), Vec_IntSize(p->vNodes) ); 

    if ( Vec_IntSize(p->vLeaves) > 128 || Vec_IntSize(p->vAnds) > p->nVars )
    {
        if ( p->fVeryVerbose )
        printf( "Obj %d: Encountered window with %d inputs and %d internal nodes.\n", iPivot, Vec_IntSize(p->vLeaves), Vec_IntSize(p->vAnds) );
        p->nLargeWins++;
        return 0;
    }
    if ( Vec_IntSize(p->vAnds) < 10 )
    {
        if ( p->fVeryVerbose )
        printf( "Skipping.\n" );
        return 0;
    }

    // derive cuts
    Sbl_ManComputeCuts( p );
    // derive SAT instance
    Sbl_ManCreateCnf( p );

    if ( p->fVeryVeryVerbose )
    printf( "All clauses = %d.  Multi clauses = %d.  Binary clauses = %d.  Other clauses = %d.\n\n", 
        sat_solver_nclauses(p->pSat), Vec_IntSize(p->vAnds), Vec_WrdSize(p->vCutsI1) - Vec_IntSize(p->vAnds), 
        sat_solver_nclauses(p->pSat) - Vec_WrdSize(p->vCutsI1) );

    // create assumptions
    // cardinality
    Vec_IntClear( p->vAssump );
    Vec_IntPush( p->vAssump, -1 );
    // unused variables
    for ( i = Vec_IntSize(p->vAnds); i < p->Power2; i++ )
        Vec_IntPush( p->vAssump, Abc_Var2Lit(i, 1) );
    // root variables
    Vec_IntForEachEntry( p->vRootVars, Root, i )
        Vec_IntPush( p->vAssump, Abc_Var2Lit(Root, 0) );
//    Vec_IntPrint( p->vAssump );

    StartSol = Vec_IntSize(p->vSolInit) + 1;
//    StartSol = 30;
    while ( fKeepTrying && StartSol-fKeepTrying > 0 )
    {
        int Count = 0, LitCount = 0;
        int nConfBef, nConfAft;
        if ( p->fVeryVerbose )
            printf( "Trying to find mapping with %d LUTs.\n", StartSol-fKeepTrying );
    //    for ( i = Vec_IntSize(p->vSolInit)-5; i < nVars; i++ )
    //        Vec_IntPush( p->vAssump, Abc_Var2Lit(Vec_IntEntry(p->vCardVars, i), 1) );
        Vec_IntWriteEntry( p->vAssump, 0, Abc_Var2Lit(Vec_IntEntry(p->vCardVars, StartSol-fKeepTrying), 1) );
        // solve the problem
        clk2 = Abc_Clock();
        nConfBef = (int)p->pSat->stats.conflicts;
        status = sat_solver_solve( p->pSat, Vec_IntArray(p->vAssump), Vec_IntLimit(p->vAssump), p->nBTLimit, 0, 0, 0 );
        p->timeSat += Abc_Clock() - clk2;
        nConfAft = (int)p->pSat->stats.conflicts;
        nConfTotal += nConfAft - nConfBef;
        nIters++;
        p->nRuns++;
        if ( status == l_True )
            p->timeSatSat += Abc_Clock() - clk2;
        else if ( status == l_False )
            p->timeSatUns += Abc_Clock() - clk2;
        else 
            p->timeSatUnd += Abc_Clock() - clk2;
        if ( status == l_Undef )
            break;
        if ( status == l_True )
        {
            if ( p->fVeryVeryVerbose )
            {
                for ( i = 0; i < Vec_IntSize(p->vAnds); i++ )
                    printf( "%d", sat_solver_var_value(p->pSat, i) );
                printf( "\n" );
                for ( i = 0; i < Vec_IntSize(p->vAnds); i++ )
                    if ( sat_solver_var_value(p->pSat, i) )
                    {
                        printf( "%d=%d ", i, sat_solver_var_value(p->pSat, i) );
                        Count++;
                    }
                printf( "Count = %d\n", Count );
            }
//            for ( i = p->FirstVar; i < sat_solver_nvars(p->pSat); i++ )
//                printf( "%d", sat_solver_var_value(p->pSat, i) );
//            printf( "\n" );
            Count = 1;
            Vec_IntClear( p->vSolCur );
            for ( i = p->FirstVar; i < sat_solver_nvars(p->pSat); i++ )
                if ( sat_solver_var_value(p->pSat, i) )
                {
                    if ( p->fVeryVeryVerbose )
                        printf( "Cut %3d : Node = %3d %6d  ", Count++, Vec_IntEntry(p->vCutsObj, i-p->FirstVar), Vec_IntEntry(p->vAnds, Vec_IntEntry(p->vCutsObj, i-p->FirstVar)) );
                    if ( p->fVeryVeryVerbose )
                        LitCount += Sbl_ManFindAndPrintCut( p, i-p->FirstVar );
                    Vec_IntPush( p->vSolCur, i-p->FirstVar );
                }
            //Vec_IntPrint( p->vRootVars );
            //Vec_IntPrint( p->vRoots );
            //Vec_IntPrint( p->vAnds );
            //Vec_IntPrint( p->vLeaves );
        }

//        fKeepTrying = status == l_True ? fKeepTrying + 1 : 0;
        // check the timing
        if ( status == l_True )
        {
            if ( p->fDelay && !Sbl_ManEvaluateMapping(p, p->DelayMax) )
            {
                int iLit, value;
                if ( p->fVeryVerbose )
                {
                    printf( "Critical path of length (%d) is detected:   ", Vec_IntSize(p->vPath) );
                    Vec_IntForEachEntry( p->vPath, iLit, i )
                        printf( "%d=%d ", i, Vec_IntEntry(p->vAnds, Abc_Lit2Var(iLit)) );
                    printf( "\n" );
                }
                // add the clause
                value = sat_solver_addclause( p->pSat, Vec_IntArray(p->vPath), Vec_IntLimit(p->vPath)  );
                assert( value );
            }
            else
            {
                Vec_IntClear( p->vSolBest );
                Vec_IntAppend( p->vSolBest, p->vSolCur );
                fKeepTrying++;
            }
        }
        else
            fKeepTrying = 0;
        if ( p->fVeryVerbose )
        {
            if ( status == l_False )
                printf( "UNSAT " );
            else if ( status == l_True )
                printf( "SAT   " );
            else 
                printf( "UNDEC " );
            printf( "confl =%8d.    ", nConfAft - nConfBef );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk2 );

            printf( "Total " );
            printf( "confl =%8d.    ", nConfTotal );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            if ( p->fVeryVeryVerbose && status == l_True )
                printf( "LitCount = %d.\n", LitCount );
            printf( "\n" );
        }
        if ( nIters == 10 )
        {
            p->nIterOuts++;
            //printf( "Obj %d : Quitting after %d iterations.\n", iPivot, nIters );
            break;
        }
    }

    // update solution
    if ( Vec_IntSize(p->vSolBest) > 0 && Vec_IntSize(p->vSolBest) < Vec_IntSize(p->vSolInit) )
    {
        int nDelayCur, nEdgesCur = 0;
        Sbl_ManUpdateMapping( p );
        if ( p->pGia->vEdge1 )
        {
            nDelayCur = Gia_ManEvalEdgeDelay( p->pGia );
            nEdgesCur = Gia_ManEvalEdgeCount( p->pGia );
        }
        else
            nDelayCur = Sbl_ManCreateTiming( p, p->DelayMax );
        if ( p->fVerbose )
        printf( "Object %5d : Saved %2d nodes  (Conf =%8d)  Iter =%3d  Delay = %d  Edges = %4d\n", 
            iPivot, Vec_IntSize(p->vSolInit)-Vec_IntSize(p->vSolBest), nConfTotal, nIters, nDelayCur, nEdgesCur );
        p->timeTotal += Abc_Clock() - p->timeStart;
        p->nImproved++;
        return 2;
    }
    else
    {
//        printf( "Object %5d : Saved %2d nodes  (Conf =%8d)  Iter =%3d\n", iPivot, 0, nConfTotal, nIters );
    }
    p->timeTotal += Abc_Clock() - p->timeStart;
    return 1;
}